

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_otsshihua_list_instance.cc
# Opt level: O0

int __thiscall
aliyun::OtsShihua::ListInstance
          (OtsShihua *this,OtsShihuaListInstanceResponseType *response,
          OtsShihuaErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AliRpcRequest *pAVar4;
  ulong uVar5;
  Value *pVVar6;
  bool local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  byte local_3b2;
  allocator<char> local_3b1;
  string local_3b0;
  byte local_38a;
  allocator<char> local_389;
  string local_388;
  byte local_362;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  Reader reader;
  Value val;
  string local_170;
  undefined1 local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  AliRpcRequest *local_90;
  AliRpcRequest *req_rpc;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string secheme;
  int local_48;
  bool parse_success;
  int ret;
  int status_code;
  string str_response;
  OtsShihuaErrorInfo *error_info_local;
  OtsShihuaListInstanceResponseType *response_local;
  OtsShihua *this_local;
  
  str_response.field_2._8_8_ = error_info;
  std::__cxx11::string::string((string *)&ret);
  secheme.field_2._M_local_buf[0xf] = '\0';
  pcVar3 = "http";
  if ((this->use_tls_ & 1U) != 0) {
    pcVar3 = "https";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar3,&local_71);
  std::allocator<char>::~allocator(&local_71);
  pAVar4 = (AliRpcRequest *)operator_new(0x2c8);
  local_149 = 1;
  pcVar3 = this->version_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar3,&local_b1);
  pcVar3 = this->appid_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar3,&local_d9);
  pcVar3 = this->secret_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar3,&local_101);
  std::operator+(&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"://"
                );
  std::operator+(&local_128,&local_148,this->host_);
  AliRpcRequest::AliRpcRequest(pAVar4,&local_b0,&local_d8,&local_100,&local_128);
  local_149 = 0;
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_90 = pAVar4;
  if ((((this->use_tls_ & 1U) == 0) && (this->proxy_host_ != (char *)0x0)) &&
     (*this->proxy_host_ != '\0')) {
    pcVar3 = this->proxy_host_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,pcVar3,(allocator<char> *)((long)&val.comments_ + 7));
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)pAVar4,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val.comments_ + 7));
  }
  Json::Value::Value((Value *)&reader.features_,nullValue);
  Json::Reader::Reader((Reader *)local_2a0);
  pAVar4 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Action",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"ListInstance",&local_2e9)
  ;
  AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pAVar4 = local_90;
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"RegionId",&local_311);
    pcVar3 = this->region_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,pcVar3,&local_339);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_310,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
  }
  iVar2 = (**(local_90->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar2 == 0) {
    local_48 = AliHttpRequest::WaitResponseHeaderComplete(&local_90->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_90->super_AliHttpRequest,(string *)&ret);
    if ((0 < local_48) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      secheme.field_2._M_local_buf[0xf] =
           Json::Reader::parse((Reader *)local_2a0,(string *)&ret,(Value *)&reader.features_,true);
    }
    if ((secheme.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (str_response.field_2._8_8_ != 0) {
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),"parse response failed");
      }
      local_48 = -1;
    }
    else {
      if (((local_48 != 200) && (str_response.field_2._8_8_ != 0)) &&
         ((secheme.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_362 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"RequestId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_360,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_362 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_360,anon_var_dwarf_70841 + 9,&local_361);
        }
        std::__cxx11::string::operator=((string *)str_response.field_2._8_8_,(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        if ((local_362 & 1) != 0) {
          std::allocator<char>::~allocator(&local_361);
        }
        local_38a = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"Code");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Code");
          Json::Value::asString_abi_cxx11_(&local_388,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_38a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_388,anon_var_dwarf_70841 + 9,&local_389);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),(string *)&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        if ((local_38a & 1) != 0) {
          std::allocator<char>::~allocator(&local_389);
        }
        local_3b2 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"HostId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"HostId");
          Json::Value::asString_abi_cxx11_(&local_3b0,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_3b2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b0,anon_var_dwarf_70841 + 9,&local_3b1);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x60),(string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        if ((local_3b2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_3b1);
        }
        local_3da = Json::Value::isMember((Value *)&reader.features_,"Message");
        if (local_3da) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Message");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,anon_var_dwarf_70841 + 9,&local_3d9);
        }
        local_3da = !local_3da;
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x40),(string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        if (local_3da) {
          std::allocator<char>::~allocator(&local_3d9);
        }
      }
      if ((local_48 == 200) && (response != (OtsShihuaListInstanceResponseType *)0x0)) {
        anon_unknown.dwarf_1738e::Json2Type((Value *)&reader.features_,response);
      }
    }
  }
  else {
    if (str_response.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=
                ((string *)(str_response.field_2._8_8_ + 0x20),"connect to host failed");
    }
    local_48 = -1;
  }
  pAVar4 = local_90;
  if (local_90 != (AliRpcRequest *)0x0) {
    AliRpcRequest::~AliRpcRequest(local_90);
    operator_delete(pAVar4,0x2c8);
  }
  Json::Reader::~Reader((Reader *)local_2a0);
  Json::Value::~Value((Value *)&reader.features_);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&ret);
  return local_48;
}

Assistant:

int OtsShihua::ListInstance(OtsShihuaListInstanceResponseType* response,
                       OtsShihuaErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListInstance");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}